

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

bool load_png(char *pFilename,image_u8 *img)

{
  pointer pcVar1;
  uint uVar2;
  uint h;
  uint w;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  uint local_64;
  uint local_60;
  allocator<char> local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  string local_38;
  
  img->m_width = 0;
  img->m_height = 0;
  pcVar1 = (img->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((img->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (img->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
  }
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = 0;
  local_64 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pFilename,&local_59);
  uVar2 = lodepng::decode(&local_58,&local_60,&local_64,&local_38,LCT_RGBA,8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (uVar2 == 0) {
    img->m_width = 0;
    img->m_height = 0;
    pcVar1 = (img->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((img->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar1) {
      (img->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar1;
    }
    img->m_width = local_60;
    img->m_height = local_64;
    std::vector<color_quad_u8,_std::allocator<color_quad_u8>_>::resize
              (&img->m_pixels,(ulong)(local_64 * local_60));
    memcpy((img->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl
           .super__Vector_impl_data._M_start,
           local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,(ulong)(local_64 * local_60) << 2);
  }
  else {
    fprintf(_stderr,"Failed loading PNG file %s\n",pFilename);
  }
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return uVar2 == 0;
}

Assistant:

static bool load_png(const char *pFilename, image_u8 &img)
{
	img.clear();

	std::vector<unsigned char> pixels;
	unsigned int w = 0, h = 0;
	unsigned int e = lodepng::decode(pixels, w, h, pFilename);
	if (e != 0)
	{
		fprintf(stderr, "Failed loading PNG file %s\n", pFilename);
		return false;
	}

	img.init(w, h);
	memcpy(&img.get_pixels()[0], &pixels[0], w * h * sizeof(uint32_t));
	
	return true;
}